

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenArrayGet(BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenExpressionRef index,
                BinaryenType type,bool signed_)

{
  ArrayGet *this;
  
  this = (ArrayGet *)MixedArena::allocSpace(&module->allocator,0x28,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)74>).super_Expression._id = ArrayGetId;
  this->ref = ref;
  this->index = index;
  (this->super_SpecificExpression<(wasm::Expression::Id)74>).super_Expression.type.id = type;
  this->signed_ = signed_;
  wasm::ArrayGet::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenArrayGet(BinaryenModuleRef module,
                                       BinaryenExpressionRef ref,
                                       BinaryenExpressionRef index,
                                       BinaryenType type,
                                       bool signed_) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeArrayGet((Expression*)ref, (Expression*)index, Type(type), signed_));
}